

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundexFuzz.cpp
# Opt level: O2

void __thiscall SoundexFuzz_RandomizeAll_Test::TestBody(SoundexFuzz_RandomizeAll_Test *this)

{
  int iVar1;
  time_t tVar2;
  ulong uVar3;
  int iVar4;
  AssertHelper AStack_78;
  string word;
  string local_50 [32];
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (iVar4 = 0; iVar4 != 100000; iVar4 = iVar4 + 1) {
    iVar1 = rand();
    uVar3 = (long)iVar1 % 6 & 0xffffffff;
    std::__cxx11::string::string((string *)&word,"",(allocator *)&AStack_78);
    while (iVar1 = (int)uVar3, uVar3 = (ulong)(iVar1 - 1), iVar1 != 0) {
      rand();
      std::__cxx11::string::push_back((char)&word);
    }
    Soundex::encode(local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&word);
  }
  testing::Message::Message((Message *)&word);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_78,kSuccess,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kazz47[P]soundex/test/soundexFuzz.cpp"
             ,0x18,"Succeeded");
  testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&word);
  testing::internal::AssertHelper::~AssertHelper(&AStack_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&word);
  return;
}

Assistant:

TEST(SoundexFuzz, RandomizeAll) {
    srand(time(NULL));

    for (int i = 0; i < 100000; i++) {
        unsigned int numChars = rand() % (int)(1.5 * Soundex::ENCODING_SIZE);

        string word = "";
        for (int i = 0; i < numChars; i++) {
            word += rand() % 256;
        }

        Soundex::encode(word);
    }

    SUCCEED();
}